

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this,Imputer *from)

{
  bool bVar1;
  ImputedValueCase IVar2;
  ReplaceValueCase RVar3;
  int64_t iVar4;
  string *psVar5;
  string *psVar6;
  Arena *pAVar7;
  DoubleVector *this_00;
  DoubleVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  StringToDoubleMap *this_02;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *this_03;
  Int64ToDoubleMap *from_03;
  double dVar8;
  Imputer *from_local;
  Imputer *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_006efb88;
  ImputedValueUnion::ImputedValueUnion
            ((ImputedValueUnion *)&(this->ImputedValue_).imputedstringvalue_);
  ReplaceValueUnion::ReplaceValueUnion
            ((ReplaceValueUnion *)&(this->ReplaceValue_).replacestringvalue_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  clear_has_ImputedValue(this);
  IVar2 = ImputedValue_case(from);
  switch(IVar2) {
  case IMPUTEDVALUE_NOT_SET:
    break;
  case kImputedDoubleValue:
    dVar8 = _internal_imputeddoublevalue(from);
    _internal_set_imputeddoublevalue(this,dVar8);
    break;
  case kImputedInt64Value:
    iVar4 = _internal_imputedint64value(from);
    _internal_set_imputedint64value(this,iVar4);
    break;
  case kImputedStringValue:
    psVar5 = _internal_imputedstringvalue_abi_cxx11_(from);
    bVar1 = _internal_has_imputedstringvalue(this);
    if (!bVar1) {
      clear_ImputedValue(this);
      set_has_imputedstringvalue(this);
      psVar6 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                (&(this->ImputedValue_).imputedstringvalue_,psVar6);
    }
    pAVar7 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ImputedValue_,psVar5,pAVar7);
    break;
  case kImputedDoubleArray:
    this_00 = _internal_mutable_imputeddoublearray(this);
    from_00 = _internal_imputeddoublearray(from);
    DoubleVector::MergeFrom(this_00,from_00);
    break;
  case kImputedInt64Array:
    this_01 = _internal_mutable_imputedint64array(this);
    from_01 = _internal_imputedint64array(from);
    Int64Vector::MergeFrom(this_01,from_01);
    break;
  case kImputedStringDictionary:
    this_02 = _internal_mutable_imputedstringdictionary(this);
    from_02 = _internal_imputedstringdictionary(from);
    StringToDoubleMap::MergeFrom(this_02,from_02);
    break;
  case kImputedInt64Dictionary:
    this_03 = _internal_mutable_imputedint64dictionary(this);
    from_03 = _internal_imputedint64dictionary(from);
    Int64ToDoubleMap::MergeFrom(this_03,from_03);
  }
  clear_has_ReplaceValue(this);
  RVar3 = ReplaceValue_case(from);
  switch(RVar3) {
  case REPLACEVALUE_NOT_SET:
    break;
  case kReplaceDoubleValue:
    dVar8 = _internal_replacedoublevalue(from);
    _internal_set_replacedoublevalue(this,dVar8);
    break;
  case kReplaceInt64Value:
    iVar4 = _internal_replaceint64value(from);
    _internal_set_replaceint64value(this,iVar4);
    break;
  case kReplaceStringValue:
    psVar5 = _internal_replacestringvalue_abi_cxx11_(from);
    bVar1 = _internal_has_replacestringvalue(this);
    if (!bVar1) {
      clear_ReplaceValue(this);
      set_has_replacestringvalue(this);
      psVar6 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                (&(this->ReplaceValue_).replacestringvalue_,psVar6);
    }
    pAVar7 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ReplaceValue_,psVar5,pAVar7);
  }
  return;
}

Assistant:

Imputer::Imputer(const Imputer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_ImputedValue();
  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      _internal_set_imputeddoublevalue(from._internal_imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      _internal_set_imputedint64value(from._internal_imputedint64value());
      break;
    }
    case kImputedStringValue: {
      _internal_set_imputedstringvalue(from._internal_imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      _internal_mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from._internal_imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      _internal_mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      _internal_mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from._internal_imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      _internal_mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from._internal_imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  clear_has_ReplaceValue();
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      _internal_set_replacedoublevalue(from._internal_replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      _internal_set_replaceint64value(from._internal_replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      _internal_set_replacestringvalue(from._internal_replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Imputer)
}